

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcsstr(char16_t *string,char16_t *strCharSet)

{
  char16_t *pcVar1;
  int local_24;
  char16_t *pcStack_20;
  int i;
  char16_t *ret;
  char16_t *strCharSet_local;
  char16_t *string_local;
  
  pcStack_20 = (char16_t *)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (string == (char16_t *)0x0) {
    pcStack_20 = (char16_t *)0x0;
    pcVar1 = pcStack_20;
  }
  else if (strCharSet == (char16_t *)0x0) {
    pcStack_20 = (char16_t *)0x0;
    pcVar1 = pcStack_20;
  }
  else {
    pcVar1 = string;
    strCharSet_local = string;
    if (*strCharSet != L'\0') {
      for (; pcVar1 = pcStack_20, *strCharSet_local != L'\0';
          strCharSet_local = strCharSet_local + 1) {
        local_24 = 0;
        while( true ) {
          if (strCharSet[local_24] == L'\0') {
            pcStack_20 = strCharSet_local;
            pcVar1 = pcStack_20;
            goto LAB_00135d9f;
          }
          if (strCharSet_local[local_24] == L'\0') {
            pcStack_20 = (char16_t *)0x0;
            pcVar1 = pcStack_20;
            goto LAB_00135d9f;
          }
          if (strCharSet_local[local_24] != strCharSet[local_24]) break;
          local_24 = local_24 + 1;
        }
      }
    }
  }
LAB_00135d9f:
  pcStack_20 = pcVar1;
  if (PAL_InitializeChakraCoreCalled) {
    return pcStack_20;
  }
  abort();
}

Assistant:

const char16_t *
__cdecl
PAL_wcsstr(
        const char16_t *string,
        const char16_t *strCharSet)
{
    char16_t *ret = NULL;
    int i;

    PERF_ENTRY(wcsstr);
    ENTRY("wcsstr (string=%p (%S), strCharSet=%p (%S))\n",
      string?string:W16_NULLSTRING,
      string?string:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING, strCharSet?strCharSet:W16_NULLSTRING);

    if (string == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (strCharSet == NULL)
    {
        ret = NULL;
        goto leave;
    }

    if (*strCharSet == 0)
    {
        ret = (char16_t *)string;
        goto leave;
    }

    while (*string != 0)
    {
        i = 0;
        while (1)
        {
            if (*(strCharSet + i) == 0)
            {
                ret = (char16_t *) string;
                goto leave;
            }
            else if (*(string + i) == 0)
            {
                ret = NULL;
                goto leave;
            }
            if (*(string + i) != *(strCharSet + i))
            {
                break;
            }

            i++;
        }
        string++;
    }

 leave:
    LOGEXIT("wcsstr returning char16_t %p (%S)\n", ret?ret:W16_NULLSTRING, ret?ret:W16_NULLSTRING);
    PERF_EXIT(wcsstr);
    return ret;
}